

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# make_unique.h
# Opt level: O0

unique_ptr<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>_>
 __thiscall
spvtools::
MakeUnique<spvtools::opt::analysis::MatrixConstant,spvtools::opt::analysis::Matrix_const*&,std::vector<spvtools::opt::analysis::Constant_const*,std::allocator<spvtools::opt::analysis::Constant_const*>>&>
          (spvtools *this,Matrix **args,
          vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
          *args_1)

{
  MatrixConstant *this_00;
  vector<const_spvtools::opt::analysis::Constant_*,_std::allocator<const_spvtools::opt::analysis::Constant_*>_>
  *args_local_1;
  Matrix **args_local;
  
  this_00 = (MatrixConstant *)::operator_new(0x30);
  opt::analysis::MatrixConstant::MatrixConstant(this_00,*args,args_1);
  std::
  unique_ptr<spvtools::opt::analysis::MatrixConstant,std::default_delete<spvtools::opt::analysis::MatrixConstant>>
  ::unique_ptr<std::default_delete<spvtools::opt::analysis::MatrixConstant>,void>
            ((unique_ptr<spvtools::opt::analysis::MatrixConstant,std::default_delete<spvtools::opt::analysis::MatrixConstant>>
              *)this,this_00);
  return (__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
          )(__uniq_ptr_data<spvtools::opt::analysis::MatrixConstant,_std::default_delete<spvtools::opt::analysis::MatrixConstant>,_true,_true>
            )this;
}

Assistant:

std::unique_ptr<T> MakeUnique(Args&&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}